

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

CURLcode Curl_reconnect_request(connectdata **connp)

{
  connectdata *pcVar1;
  SessionHandle *data;
  CURLcode CVar2;
  _Bool async;
  _Bool protocol_done;
  connectdata *local_28;
  
  pcVar1 = *connp;
  data = pcVar1->data;
  local_28 = pcVar1;
  Curl_infof(data,"Re-used connection seems dead, get a new one\n");
  (pcVar1->bits).close = true;
  CVar2 = Curl_done(&local_28,CURLE_OK,false);
  *connp = (connectdata *)0x0;
  if ((CVar2 == CURLE_SEND_ERROR) || (CVar2 == CURLE_OK)) {
    protocol_done = true;
    CVar2 = Curl_connect(data,connp,&async,&protocol_done);
    if (CVar2 == CURLE_OK) {
      CVar2 = CURLE_COULDNT_RESOLVE_HOST;
      if (async == false) {
        CVar2 = CURLE_OK;
      }
    }
  }
  return CVar2;
}

Assistant:

CURLcode
Curl_reconnect_request(struct connectdata **connp)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = *connp;
  struct SessionHandle *data = conn->data;

  /* This was a re-use of a connection and we got a write error in the
   * DO-phase. Then we DISCONNECT this connection and have another attempt to
   * CONNECT and then DO again! The retry cannot possibly find another
   * connection to re-use, since we only keep one possible connection for
   * each.  */

  infof(data, "Re-used connection seems dead, get a new one\n");

  connclose(conn, "Reconnect dead connection"); /* enforce close */
  result = Curl_done(&conn, result, FALSE); /* we are so done with this */

  /* conn may no longer be a good pointer, clear it to avoid mistakes by
     parent functions */
  *connp = NULL;

  /*
   * According to bug report #1330310. We need to check for CURLE_SEND_ERROR
   * here as well. I figure this could happen when the request failed on a FTP
   * connection and thus Curl_done() itself tried to use the connection
   * (again). Slight Lack of feedback in the report, but I don't think this
   * extra check can do much harm.
   */
  if(!result || (CURLE_SEND_ERROR == result)) {
    bool async;
    bool protocol_done = TRUE;

    /* Now, redo the connect and get a new connection */
    result = Curl_connect(data, connp, &async, &protocol_done);
    if(!result) {
      /* We have connected or sent away a name resolve query fine */

      conn = *connp; /* setup conn to again point to something nice */
      if(async) {
        /* Now, if async is TRUE here, we need to wait for the name
           to resolve */
        result = Curl_resolver_wait_resolv(conn, NULL);
        if(result)
          return result;

        /* Resolved, continue with the connection */
        result = Curl_async_resolved(conn, &protocol_done);
        if(result)
          return result;
      }
    }
  }

  return result;
}